

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statement.cpp
# Opt level: O3

void __thiscall SQLite::Statement::Statement(Statement *this,Database *aDatabase,char *apQuery)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  allocator local_11;
  
  std::__cxx11::string::string((string *)this,apQuery,&local_11);
  this->mpSQLite =
       (aDatabase->mSQLitePtr)._M_t.super___uniq_ptr_impl<sqlite3,_SQLite::Database::Deleter>._M_t.
       super__Tuple_impl<0UL,_sqlite3_*,_SQLite::Database::Deleter>.
       super__Head_base<0UL,_sqlite3_*,_false>._M_head_impl;
  prepareStatement((Statement *)&this->mpPreparedStatement);
  this->mColumnCount = 0;
  this->mbHasRow = false;
  this->mbDone = false;
  p_Var1 = &(this->mColumnNames)._M_t._M_impl.super__Rb_tree_header;
  (this->mColumnNames)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->mColumnNames)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->mColumnNames)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->mColumnNames)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->mColumnNames)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  iVar2 = sqlite3_column_count
                    ((this->mpPreparedStatement).
                     super___shared_ptr<sqlite3_stmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  this->mColumnCount = iVar2;
  return;
}

Assistant:

Statement::Statement(const Database& aDatabase, const char* apQuery) :
    mQuery(apQuery),
    mpSQLite(aDatabase.getHandle()),
    mpPreparedStatement(prepareStatement()) // prepare the SQL query (needs Database friendship)
{
    mColumnCount = sqlite3_column_count(mpPreparedStatement.get());
}